

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O1

void __thiscall
fmt::v9::detail::dynamic_arg_list::typed_node<std::__cxx11::string>::
typed_node<std::__cxx11::string>
          (typed_node<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg)

{
  pointer pcVar1;
  
  *(undefined8 *)(this + 8) = 0;
  *(undefined ***)this = &PTR__typed_node_004e92c8;
  *(typed_node<std::__cxx11::string> **)(this + 0x10) = this + 0x20;
  pcVar1 = (arg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 0x10),pcVar1,pcVar1 + arg->_M_string_length);
  return;
}

Assistant:

FMT_CONSTEXPR typed_node(const Arg& arg) : value(arg) {}